

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NtkTimeSetInputDrive(Abc_Ntk_t *pNtk,int PiNum,float Rise,float Fall)

{
  float fVar1;
  Abc_ManTime_t *pAVar2;
  Abc_Time_t *pAVar3;
  long lVar4;
  size_t __nmemb;
  
  if ((PiNum < 0) || (pNtk->vCis->nSize <= PiNum)) {
    __assert_fail("PiNum >= 0 && PiNum < Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                  ,0x122,"void Abc_NtkTimeSetInputDrive(Abc_Ntk_t *, int, float, float)");
  }
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    pAVar2 = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = pAVar2;
  }
  pAVar2 = pNtk->pManTime;
  fVar1 = (pAVar2->tInDriveDef).Rise;
  if ((fVar1 == Rise) && (!NAN(fVar1) && !NAN(Rise))) {
    fVar1 = (pAVar2->tInDriveDef).Fall;
    if ((fVar1 == Fall) && (!NAN(fVar1) && !NAN(Fall))) {
      return;
    }
  }
  if (pAVar2->tInDrive == (Abc_Time_t *)0x0) {
    __nmemb = (size_t)pNtk->vCis->nSize;
    pAVar3 = (Abc_Time_t *)calloc(__nmemb,8);
    pAVar2->tInDrive = pAVar3;
    if (0 < (long)__nmemb) {
      lVar4 = 0;
      do {
        pNtk->pManTime->tInDrive[lVar4] = pNtk->pManTime->tInDriveDef;
        lVar4 = lVar4 + 1;
      } while (lVar4 < pNtk->vCis->nSize);
    }
  }
  pAVar3 = pNtk->pManTime->tInDrive;
  pAVar3[(uint)PiNum].Rise = Rise;
  pAVar3[(uint)PiNum].Fall = Fall;
  return;
}

Assistant:

void Abc_NtkTimeSetInputDrive( Abc_Ntk_t * pNtk, int PiNum, float Rise, float Fall )
{
    Abc_Time_t * pTime;
    assert( PiNum >= 0 && PiNum < Abc_NtkCiNum(pNtk) );
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    if ( pNtk->pManTime->tInDriveDef.Rise == Rise && pNtk->pManTime->tInDriveDef.Fall == Fall )
        return;
    if ( pNtk->pManTime->tInDrive == NULL )
    {
        int i;
        pNtk->pManTime->tInDrive = ABC_CALLOC( Abc_Time_t, Abc_NtkCiNum(pNtk) );
        for ( i = 0; i < Abc_NtkCiNum(pNtk); i++ )
            pNtk->pManTime->tInDrive[i] = pNtk->pManTime->tInDriveDef;
    }
    pTime = pNtk->pManTime->tInDrive + PiNum;
    pTime->Rise  = Rise;
    pTime->Fall  = Fall;
}